

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,ClassDeclaration *class_declaration)

{
  NewScopeLayer *parent;
  NewScopeLayer *pNVar1;
  NewScopeLayer *this_00;
  string local_a8;
  string local_88;
  string local_58;
  Symbol local_38;
  ClassDeclaration *local_18;
  ClassDeclaration *class_declaration_local;
  NewSymbolTreeVisitor *this_local;
  
  local_18 = class_declaration;
  class_declaration_local = (ClassDeclaration *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)&class_declaration->class_name_);
  Symbol::Symbol(&local_38,&local_58);
  Symbol::operator=(&this->current_layer_->class_symbol_,&local_38);
  Symbol::~Symbol(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (NewScopeLayer *)operator_new(0x168);
  parent = this->current_layer_;
  std::__cxx11::string::string((string *)&local_88,(string *)&local_18->class_name_);
  pNVar1 = this->current_layer_;
  local_a8.field_2._M_allocated_capacity = 0;
  local_a8.field_2._8_8_ = 0;
  local_a8._M_dataplus = (_Alloc_hider)0x0;
  local_a8._1_7_ = 0;
  local_a8._M_string_length = 0;
  Symbol::Symbol((Symbol *)&local_a8);
  NewScopeLayer::NewScopeLayer(this_00,parent,&local_88,&pNVar1->class_symbol_,(Symbol *)&local_a8);
  this->current_layer_ = this_00;
  Symbol::~Symbol((Symbol *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  (**(local_18->declarations_->super_Statement).super_Node._vptr_Node)(local_18->declarations_,this)
  ;
  this->current_layer_ = this->current_layer_->parent_;
  return;
}

Assistant:

void NewSymbolTreeVisitor::Visit(ClassDeclaration* class_declaration) {
  current_layer_->class_symbol_ = Symbol(class_declaration->class_name_);
  // PreVisiting checks if class is already declared
  // new scope
  current_layer_ =
      new NewScopeLayer(current_layer_, class_declaration->class_name_,
                        current_layer_->class_symbol_, Symbol());

  class_declaration->declarations_->Accept(this);

  current_layer_ = current_layer_->parent_;
}